

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O0

void __thiscall
LASwriteItemCompressed_BYTE14_v4::~LASwriteItemCompressed_BYTE14_v4
          (LASwriteItemCompressed_BYTE14_v4 *this)

{
  ArithmeticModel **ppAVar1;
  U8 *pUVar2;
  ArithmeticEncoder *this_00;
  uint local_18;
  uint local_14;
  U32 i;
  U32 c;
  LASwriteItemCompressed_BYTE14_v4 *this_local;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_001b12e0;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    if (this->contexts[local_14].m_bytes != (ArithmeticModel **)0x0) {
      for (local_18 = 0; local_18 < this->number; local_18 = local_18 + 1) {
        ArithmeticEncoder::destroySymbolModel
                  (this->enc_Bytes[local_18],this->contexts[local_14].m_bytes[local_18]);
      }
      ppAVar1 = this->contexts[local_14].m_bytes;
      if (ppAVar1 != (ArithmeticModel **)0x0) {
        operator_delete__(ppAVar1);
      }
      pUVar2 = this->contexts[local_14].last_item;
      if (pUVar2 != (U8 *)0x0) {
        operator_delete__(pUVar2);
      }
    }
  }
  if (this->outstream_Bytes != (ByteStreamOutArray **)0x0) {
    for (local_18 = 0; local_18 < this->number; local_18 = local_18 + 1) {
      if (this->outstream_Bytes[local_18] != (ByteStreamOutArray *)0x0) {
        if (this->outstream_Bytes[local_18] != (ByteStreamOutArray *)0x0) {
          (*(this->outstream_Bytes[local_18]->super_ByteStreamOut)._vptr_ByteStreamOut[0xd])();
        }
        this_00 = this->enc_Bytes[local_18];
        if (this_00 != (ArithmeticEncoder *)0x0) {
          ArithmeticEncoder::~ArithmeticEncoder(this_00);
          operator_delete(this_00);
        }
      }
    }
    if (this->outstream_Bytes != (ByteStreamOutArray **)0x0) {
      operator_delete__(this->outstream_Bytes);
    }
    if (this->enc_Bytes != (ArithmeticEncoder **)0x0) {
      operator_delete__(this->enc_Bytes);
    }
  }
  if ((this->num_bytes_Bytes != (U32 *)0x0) && (this->num_bytes_Bytes != (U32 *)0x0)) {
    operator_delete__(this->num_bytes_Bytes);
  }
  if ((this->changed_Bytes != (BOOL *)0x0) && (this->changed_Bytes != (BOOL *)0x0)) {
    operator_delete__(this->changed_Bytes);
  }
  LASwriteItemCompressed::~LASwriteItemCompressed(&this->super_LASwriteItemCompressed);
  return;
}

Assistant:

LASwriteItemCompressed_BYTE14_v4::~LASwriteItemCompressed_BYTE14_v4()
{
  /* destroy all initialized scanner channel contexts */

  U32 c, i;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_bytes)
    {
      for (i = 0; i < number; i++)
      {
        enc_Bytes[i]->destroySymbolModel(contexts[c].m_bytes[i]);
      }
      delete [] contexts[c].m_bytes;
      delete [] contexts[c].last_item;
    }
  }

  /* destroy all outstream and encoder arrays */

  if (outstream_Bytes)
  {
    for (i = 0; i < number; i++)
    {
      if (outstream_Bytes[i])
      {
        delete outstream_Bytes[i];
        delete enc_Bytes[i];
      }
    }

    delete [] outstream_Bytes;
    delete [] enc_Bytes;
  }

  /* destroy all other arrays */

  if (num_bytes_Bytes) delete [] num_bytes_Bytes;

  if (changed_Bytes) delete [] changed_Bytes;
}